

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equivalent.cpp
# Opt level: O0

bool fs_equivalent(string_view path1,string_view path2)

{
  string_view path2_00;
  string_view path1_00;
  _Bool _Var1;
  byte bVar2;
  bool bVar3;
  string_view local_198;
  error_category *local_188;
  char *pcStack_180;
  char *local_178;
  char *pcStack_170;
  undefined4 local_15c;
  path local_158;
  path local_130;
  byte local_101;
  undefined1 auStack_100 [7];
  bool e;
  string local_f0;
  __sv_type local_d0;
  string local_c0;
  allocator<char> local_99;
  undefined1 local_98 [8];
  string p2;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string p1;
  error_code ec;
  string_view path2_local;
  string_view path1_local;
  
  path2_local._M_len = (size_t)path2._M_str;
  ec._M_cat = (error_category *)path2._M_len;
  path2_local._M_str = (char *)path1._M_len;
  std::error_code::error_code((error_code *)((long)&p1.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_60,
             (basic_string_view<char,_std::char_traits<char>_> *)&path2_local._M_str,&local_61);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_98,(basic_string_view<char,_std::char_traits<char>_> *)&ec._M_cat,
             &local_99);
  std::allocator<char>::~allocator(&local_99);
  _Var1 = fs_is_mingw();
  if (_Var1) {
    local_d0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    fs_canonical_abi_cxx11_(&local_c0,local_d0,true,false);
    std::__cxx11::string::operator=((string *)local_60,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    _auStack_100 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_98);
    fs_canonical_abi_cxx11_(&local_f0,_auStack_100,true,false);
    std::__cxx11::string::operator=((string *)local_98,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_130,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
             auto_format);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_158,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
             auto_format);
  bVar2 = std::filesystem::equivalent(&local_130,&local_158,(error_code *)((long)&p1.field_2 + 8));
  std::filesystem::__cxx11::path::~path(&local_158);
  std::filesystem::__cxx11::path::~path(&local_130);
  local_101 = bVar2 & 1;
  bVar3 = std::error_code::operator_cast_to_bool((error_code *)((long)&p1.field_2 + 8));
  if (bVar3) {
    local_178 = path2_local._M_str;
    local_188 = ec._M_cat;
    pcStack_180 = (char *)path2_local._M_len;
    pcStack_170 = path1._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_198,"fs_equivalent");
    path1_00._M_str = pcStack_170;
    path1_00._M_len = (size_t)local_178;
    path2_00._M_str = pcStack_180;
    path2_00._M_len = (size_t)local_188;
    fs_print_error(path1_00,path2_00,local_198,(error_code *)((long)&p1.field_2 + 8));
    path1_local._M_str._7_1_ = false;
  }
  else {
    path1_local._M_str._7_1_ = (bool)(local_101 & 1);
  }
  local_15c = 1;
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_60);
  return path1_local._M_str._7_1_;
}

Assistant:

bool fs_equivalent(std::string_view path1, std::string_view path2)
{
  // non-existent paths are not equivalent

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM

  std::string p1(path1);
  std::string p2(path2);

  if(fs_is_mingw()){
    // MinGW falsely gives mismatch if not canonicalized
    p1 = fs_canonical(p1, true, false);
    p2 = fs_canonical(p2, true, false);
  }

  bool e = std::filesystem::equivalent(p1, p2, ec);
  if(!ec)
    return e;

#else

  int r1 = 0;
  int r2 = 0;

#if defined(STATX_BASIC_STATS) && defined(USE_STATX)

  struct statx x1;
  struct statx x2;

  r1 = statx(AT_FDCWD, path1.data(), AT_NO_AUTOMOUNT, STATX_BASIC_STATS, &x1);
  if(r1 == 0){
    r2 = statx(AT_FDCWD, path2.data(), AT_NO_AUTOMOUNT, STATX_BASIC_STATS, &x2);
    if(r2 == 0)
      return x1.stx_dev_major == x2.stx_dev_major && x1.stx_dev_minor == x2.stx_dev_minor && x1.stx_ino == x2.stx_ino;
  }

#endif

  if((r1 == 0 && r2 == 0) || errno == ENOSYS){
    struct stat s1;
    struct stat s2;

    // https://www.boost.org/doc/libs/1_86_0/libs/filesystem/doc/reference.html#equivalent
    if(!stat(path1.data(), &s1) && !stat(path2.data(), &s2))
      return s1.st_dev == s2.st_dev && s1.st_ino == s2.st_ino;
  }

#endif

  fs_print_error(path1, path2, __func__, ec);
  return false;
}